

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

void xmlFreeNodeList(xmlNodePtr cur)

{
  _xmlNode *p_Var1;
  _xmlNode *p_Var2;
  int iVar3;
  xmlDeregisterNodeFunc *pp_Var4;
  bool bVar5;
  long local_30;
  size_t depth;
  xmlDictPtr dict;
  xmlNodePtr parent;
  xmlNodePtr next;
  xmlNodePtr cur_local;
  
  depth = 0;
  local_30 = 0;
  if (cur != (xmlNodePtr)0x0) {
    if (cur->type == XML_NAMESPACE_DECL) {
      xmlFreeNsList((xmlNsPtr)cur);
    }
    else {
      next = cur;
      if (cur->doc != (_xmlDoc *)0x0) {
        depth = (size_t)cur->doc->dict;
        next = cur;
      }
      while( true ) {
        do {
          while( true ) {
            bVar5 = false;
            if ((((next->children != (_xmlNode *)0x0) &&
                 (bVar5 = false, next->type != XML_DOCUMENT_NODE)) &&
                (bVar5 = false, next->type != XML_HTML_DOCUMENT_NODE)) &&
               (bVar5 = false, next->type != XML_DTD_NODE)) {
              bVar5 = next->type != XML_ENTITY_REF_NODE;
            }
            if (!bVar5) break;
            local_30 = local_30 + 1;
            next = next->children;
          }
          p_Var1 = next->next;
          p_Var2 = next->parent;
          if ((next->type == XML_DOCUMENT_NODE) || (next->type == XML_HTML_DOCUMENT_NODE)) {
            xmlFreeDoc((xmlDocPtr)next);
          }
          else if (next->type != XML_DTD_NODE) {
            if ((__xmlRegisterCallbacks != 0) &&
               (pp_Var4 = __xmlDeregisterNodeDefaultValue(), *pp_Var4 != (xmlDeregisterNodeFunc)0x0)
               ) {
              pp_Var4 = __xmlDeregisterNodeDefaultValue();
              (**pp_Var4)(next);
            }
            if ((((next->type == XML_ELEMENT_NODE) || (next->type == XML_XINCLUDE_START)) ||
                (next->type == XML_XINCLUDE_END)) && (next->properties != (_xmlAttr *)0x0)) {
              xmlFreePropList(next->properties);
            }
            if (((((next->type != XML_ELEMENT_NODE) && (next->type != XML_XINCLUDE_START)) &&
                 ((next->type != XML_XINCLUDE_END &&
                  ((next->type != XML_ENTITY_REF_NODE &&
                   ((_xmlAttr **)next->content != &next->properties)))))) &&
                (next->content != (xmlChar *)0x0)) &&
               ((depth == 0 || (iVar3 = xmlDictOwns((xmlDictPtr)depth,next->content), iVar3 == 0))))
            {
              (*xmlFree)(next->content);
            }
            if ((((next->type == XML_ELEMENT_NODE) || (next->type == XML_XINCLUDE_START)) ||
                (next->type == XML_XINCLUDE_END)) && (next->nsDef != (xmlNs *)0x0)) {
              xmlFreeNsList(next->nsDef);
            }
            if ((((next->name != (xmlChar *)0x0) && (next->type != XML_TEXT_NODE)) &&
                ((next->type != XML_COMMENT_NODE && (next->name != (xmlChar *)0x0)))) &&
               ((depth == 0 || (iVar3 = xmlDictOwns((xmlDictPtr)depth,next->name), iVar3 == 0)))) {
              (*xmlFree)(next->name);
            }
            (*xmlFree)(next);
          }
          next = p_Var1;
        } while (p_Var1 != (_xmlNode *)0x0);
        if ((local_30 == 0) || (p_Var2 == (_xmlNode *)0x0)) break;
        local_30 = local_30 + -1;
        p_Var2->children = (_xmlNode *)0x0;
        next = p_Var2;
      }
    }
  }
  return;
}

Assistant:

void
xmlFreeNodeList(xmlNodePtr cur) {
    xmlNodePtr next;
    xmlNodePtr parent;
    xmlDictPtr dict = NULL;
    size_t depth = 0;

    if (cur == NULL) return;
    if (cur->type == XML_NAMESPACE_DECL) {
	xmlFreeNsList((xmlNsPtr) cur);
	return;
    }
    if (cur->doc != NULL) dict = cur->doc->dict;
    while (1) {
        while ((cur->children != NULL) &&
               (cur->type != XML_DOCUMENT_NODE) &&
               (cur->type != XML_HTML_DOCUMENT_NODE) &&
               (cur->type != XML_DTD_NODE) &&
               (cur->type != XML_ENTITY_REF_NODE)) {
            cur = cur->children;
            depth += 1;
        }

        next = cur->next;
        parent = cur->parent;
	if ((cur->type == XML_DOCUMENT_NODE) ||
            (cur->type == XML_HTML_DOCUMENT_NODE)) {
            xmlFreeDoc((xmlDocPtr) cur);
        } else if (cur->type != XML_DTD_NODE) {

	    if ((__xmlRegisterCallbacks) && (xmlDeregisterNodeDefaultValue))
		xmlDeregisterNodeDefaultValue(cur);

	    if (((cur->type == XML_ELEMENT_NODE) ||
		 (cur->type == XML_XINCLUDE_START) ||
		 (cur->type == XML_XINCLUDE_END)) &&
		(cur->properties != NULL))
		xmlFreePropList(cur->properties);
	    if ((cur->type != XML_ELEMENT_NODE) &&
		(cur->type != XML_XINCLUDE_START) &&
		(cur->type != XML_XINCLUDE_END) &&
		(cur->type != XML_ENTITY_REF_NODE) &&
		(cur->content != (xmlChar *) &(cur->properties))) {
		DICT_FREE(cur->content)
	    }
	    if (((cur->type == XML_ELEMENT_NODE) ||
	         (cur->type == XML_XINCLUDE_START) ||
		 (cur->type == XML_XINCLUDE_END)) &&
		(cur->nsDef != NULL))
		xmlFreeNsList(cur->nsDef);

	    /*
	     * When a node is a text node or a comment, it uses a global static
	     * variable for the name of the node.
	     * Otherwise the node name might come from the document's
	     * dictionary
	     */
	    if ((cur->name != NULL) &&
		(cur->type != XML_TEXT_NODE) &&
		(cur->type != XML_COMMENT_NODE))
		DICT_FREE(cur->name)
	    xmlFree(cur);
	}

        if (next != NULL) {
	    cur = next;
        } else {
            if ((depth == 0) || (parent == NULL))
                break;
            depth -= 1;
            cur = parent;
            cur->children = NULL;
        }
    }
}